

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *
__thiscall sf::String::toUtf32_abi_cxx11_(String *this)

{
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_00000028;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_00000030;
  
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(in_stack_00000030,in_stack_00000028);
  return in_RDI;
}

Assistant:

std::basic_string<Uint32> String::toUtf32() const
{
    return m_string;
}